

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O1

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,CondQuadConEQ *c,
          PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
          *prepro)

{
  bool bVar1;
  ulong uVar2;
  
  bVar1 = CheckEmptySubCon<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>,mp::PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>>>
                    (this,c,prepro);
  if (!bVar1) {
    uVar2 = -(ulong)(1.0 < prepro->ub_);
    prepro->lb_ = (double)(~-(ulong)(prepro->lb_ < 0.0) & (ulong)prepro->lb_);
    prepro->ub_ = (double)(~uVar2 & (ulong)prepro->ub_ | uVar2 & 0x3ff0000000000000);
    prepro->type_ = INTEGER;
    if ((*(int *)(this + 0x2ec) != 0) && (*(int *)(this + 0x2e8) != 0)) {
      FixEqualityResult<mp::PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>>,mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>>
                (this,c,prepro);
      return;
    }
  }
  return;
}

Assistant:

void PreprocessConstraint(
      CondQuadConEQ& c, PreprocessInfo& prepro) {
    if (CheckEmptySubCon(c, prepro))
      return;
    prepro.narrow_result_bounds(0.0, 1.0);
    prepro.set_result_type( var::INTEGER );
    if (0!=MPD( IfPreproEqResBounds() ))
      if (FixEqualityResult(c, prepro))
        return;
  }